

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestVat::ConnectionImpl::unblock(ConnectionImpl *this)

{
  PromiseFulfiller<void> *pPVar1;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_28;
  
  pPVar1 = (this->currentBlockFulfiller).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_28);
    kj::Maybe<kj::ForkedPromise<void>_>::operator=(&this->currentBlock);
    local_28.disposer = (Disposer *)0x0;
    local_28.ptr = (PromiseFulfiller<void> *)0x0;
    kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
              (&(this->currentBlockFulfiller).ptr,&local_28);
    kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_28);
    return;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
             ,0x14a,FAILED,"currentBlockFulfiller != nullptr","");
  kj::_::Debug::Fault::fatal((Fault *)&local_28);
}

Assistant:

void unblock() {
      // Allow blocked messages to proceed.
      KJ_REQUIRE_NONNULL(currentBlockFulfiller)->fulfill();
      currentBlock = kj::none;
      currentBlockFulfiller = kj::none;
    }